

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

uint32_t uprv_decNumberToUInt32_63(decNumber *dn,decContext *set)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  long lVar4;
  uint uVar5;
  byte *pbVar6;
  long lVar7;
  
  if ((dn->bits & 0x70) == 0) {
    iVar1 = dn->digits;
    lVar4 = (long)iVar1;
    if (((lVar4 < 0xb) && (dn->exponent == 0)) &&
       ((-1 < (char)dn->bits || ((iVar1 == 1 && (dn->lsu[0] == '\0')))))) {
      uVar5 = 0;
      if (1 < iVar1) {
        pbVar6 = &dn->field_0xa;
        lVar4 = lVar4 * 4 + -4;
        lVar7 = 0;
        uVar5 = 0;
        do {
          uVar5 = uVar5 + (uint)*pbVar6 * *(int *)((long)DECPOWERS + lVar7);
          pbVar6 = pbVar6 + 1;
          lVar7 = lVar7 + 4;
        } while (lVar4 != lVar7);
      }
      uVar3 = (uint32_t)lVar4;
      bVar2 = true;
      if ((uVar5 < 0x1999999a) && (uVar5 != 0x19999999 || dn->lsu[0] < 6)) {
        uVar3 = (uint)dn->lsu[0] + uVar5 * 10;
        bVar2 = false;
      }
      if (!bVar2) {
        return uVar3;
      }
    }
  }
  uprv_decContextSetStatus_63(set,0x80);
  return 0;
}

Assistant:

U_CAPI uInt U_EXPORT2 uprv_decNumberToUInt32(const decNumber *dn, decContext *set) {
  #if DECCHECK
  if (decCheckOperands(DECUNRESU, DECUNUSED, dn, set)) return 0;
  #endif
  /* special or too many digits, or bad exponent, or negative (<0)  */
  if (dn->bits&DECSPECIAL || dn->digits>10 || dn->exponent!=0
    || (dn->bits&DECNEG && !ISZERO(dn)));                   /* bad  */
   else { /* is a finite integer with 10 or fewer digits  */
    Int d;                         /* work  */
    const Unit *up;                /* ..  */
    uInt hi=0, lo;                 /* ..  */
    up=dn->lsu;                    /* -> lsu  */
    lo=*up;                        /* get 1 to 9 digits  */
    #if DECDPUN>1                  /* split to higher  */
      hi=lo/10;
      lo=lo%10;
    #endif
    up++;
    /* collect remaining Units, if any, into hi  */
    for (d=DECDPUN; d<dn->digits; up++, d+=DECDPUN) hi+=*up*powers[d-1];

    /* now low has the lsd, hi the remainder  */
    if (hi>429496729 || (hi==429496729 && lo>5)) ; /* no reprieve possible  */
     else return X10(hi)+lo;
    } /* integer  */
  uprv_decContextSetStatus(set, DEC_Invalid_operation); /* [may not return]  */
  return 0;
  }